

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Readable_String.h
# Opt level: O0

bool __thiscall
Jupiter::asBool<char>(Jupiter *this,basic_string_view<char,_std::char_traits<char>_> in_string)

{
  basic_string_view<char,_std::char_traits<char>_> __x;
  basic_string_view<char,_std::char_traits<char>_> __x_00;
  basic_string_view<char,_std::char_traits<char>_> __x_01;
  basic_string_view<char,_std::char_traits<char>_> __x_02;
  bool bVar1;
  char *pcVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  basic_string_view<char,_std::char_traits<char>_> bVar4;
  basic_string_view<char,_std::char_traits<char>_> in_string_local;
  
  pcVar2 = (char *)in_string._M_len;
  bVar3 = sv("FALSE",5);
  bVar4._M_str = pcVar2;
  bVar4._M_len = (size_t)this;
  bVar1 = std::operator==(bVar4,bVar3);
  if (!bVar1) {
    bVar4 = sv("false",5);
    bVar3._M_str = pcVar2;
    bVar3._M_len = (size_t)this;
    bVar1 = std::operator==(bVar3,bVar4);
    if (!bVar1) {
      bVar4 = sv("0",1);
      __x_02._M_str = pcVar2;
      __x_02._M_len = (size_t)this;
      bVar1 = std::operator==(__x_02,bVar4);
      if (!bVar1) {
        bVar4 = sv("OFF",3);
        __x_01._M_str = pcVar2;
        __x_01._M_len = (size_t)this;
        bVar1 = std::operator==(__x_01,bVar4);
        if (!bVar1) {
          bVar4 = sv("off",3);
          __x_00._M_str = pcVar2;
          __x_00._M_len = (size_t)this;
          bVar1 = std::operator==(__x_00,bVar4);
          if (!bVar1) {
            bVar4 = sv("-",1);
            __x._M_str = pcVar2;
            __x._M_len = (size_t)this;
            bVar1 = std::operator==(__x,bVar4);
            if (!bVar1) {
              return true;
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool asBool(std::basic_string_view<CharT> in_string) {
		using namespace std::literals;

		// Invert the logic here, so that we return true for numerics and "true"/"on"/"+", false otherwise
		// Note: temporarily removed case insensitivity, solely to avoid including unicode.hpp here
		if (in_string == "FALSE"sv
			|| in_string == "false"sv
			|| in_string == "0"sv
			|| in_string == "OFF"sv
			|| in_string == "off"sv
			|| in_string == "-"sv) {
			return false;
		}

		return true;
	}